

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

Point3f pbrt::SampleSphericalRectangle
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point2f u,Float *pdf)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  type d;
  type d_00;
  Float FVar10;
  Float FVar11;
  Float FVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 in_XMM0_Qb;
  ulong uVar32;
  undefined1 auVar33 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar19 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  uint uVar37;
  uint uVar38;
  uint uVar39;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  Vector3<float> VVar44;
  Vector3f VVar45;
  Vector3<float> VVar46;
  Point3<float> PVar47;
  Vector3f v;
  Tuple3<pbrt::Point3,_float> TVar48;
  Vector3f v11;
  Vector3f v10;
  Vector3f v01;
  float local_198;
  float fStack_194;
  Tuple3<pbrt::Vector3,_float> local_160;
  Point3f *local_150;
  undefined1 local_148 [16];
  float local_12c;
  Tuple3<pbrt::Vector3,float> *local_128;
  Tuple3<pbrt::Vector3,float> *local_120;
  undefined8 local_118;
  ulong uStack_110;
  Point3f *local_100;
  Tuple3<pbrt::Vector3,_float> local_f8;
  float local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  Tuple3<pbrt::Vector3,_float> local_d8;
  Tuple3<pbrt::Vector3,_float> local_c8;
  Tuple3<pbrt::Vector3,_float> local_b8;
  Frame local_ac;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  Tuple3<pbrt::Vector3,_float> local_60;
  Vector3<float> local_54;
  Vector3<float> local_48;
  Vector3<float> local_3c;
  undefined1 auVar20 [64];
  undefined1 extraout_var [60];
  undefined1 auVar34 [56];
  
  local_148._8_8_ = in_XMM0_Qb;
  local_148._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  d = Length<float>(ex);
  d_00 = Length<float>(ey);
  uVar32 = 0;
  local_128 = (Tuple3<pbrt::Vector3,float> *)ex;
  VVar44 = Tuple3<pbrt::Vector3,float>::operator/((Tuple3<pbrt::Vector3,float> *)ex,d);
  local_118 = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_150 = (Point3f *)CONCAT44(local_150._4_4_,VVar44.super_Tuple3<pbrt::Vector3,_float>.z);
  local_120 = (Tuple3<pbrt::Vector3,float> *)ey;
  uStack_110 = uVar32;
  VVar44 = Tuple3<pbrt::Vector3,float>::operator/((Tuple3<pbrt::Vector3,float> *)ey,d_00);
  VVar45.super_Tuple3<pbrt::Vector3,_float>.z = local_150._0_4_;
  VVar45.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_118;
  VVar45.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_118._4_4_;
  uVar37 = 0;
  uVar38 = 0;
  uVar39 = 0;
  auVar33 = ZEXT856(uStack_110);
  Frame::FromXY(&local_ac,VVar45,(Vector3f)VVar44.super_Tuple3<pbrt::Vector3,_float>);
  local_150 = s;
  local_100 = pRef;
  VVar44 = Point3<float>::operator-(s,pRef);
  VVar45 = Frame::ToLocal(&local_ac,VVar44.super_Tuple3<pbrt::Vector3,_float>);
  local_e8 = VVar45.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20._0_8_ = VVar45.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar20._8_56_ = auVar33;
  if (0.0 < local_e8) {
    auVar19._0_8_ = local_ac.z.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
    auVar19._8_4_ = 0x80000000;
    auVar19._12_4_ = 0x80000000;
    local_e8 = -local_e8;
    uVar37 = uVar37 ^ 0x80000000;
    uVar38 = uVar38 ^ 0x80000000;
    uVar39 = uVar39 ^ 0x80000000;
    local_ac.z.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar19);
    local_ac.z.super_Tuple3<pbrt::Vector3,_float>.z =
         -local_ac.z.super_Tuple3<pbrt::Vector3,_float>.z;
  }
  local_3c.super_Tuple3<pbrt::Vector3,_float>.x = VVar45.super_Tuple3<pbrt::Vector3,_float>.x;
  local_12c = local_3c.super_Tuple3<pbrt::Vector3,_float>.x + d;
  local_78 = auVar20._0_16_;
  auVar19 = vmovshdup_avx(local_78);
  local_48.super_Tuple3<pbrt::Vector3,_float>.y = auVar19._0_4_;
  local_54.super_Tuple3<pbrt::Vector3,_float>.y =
       local_48.super_Tuple3<pbrt::Vector3,_float>.y + d_00;
  local_60._0_8_ = vmovlps_avx(local_78);
  local_88 = ZEXT416((uint)local_54.super_Tuple3<pbrt::Vector3,_float>.y);
  uStack_e4 = uVar37;
  uStack_e0 = uVar38;
  uStack_dc = uVar39;
  local_60.z = local_e8;
  local_54.super_Tuple3<pbrt::Vector3,_float>.x = local_12c;
  local_54.super_Tuple3<pbrt::Vector3,_float>.z = local_e8;
  local_48.super_Tuple3<pbrt::Vector3,_float>.x = local_12c;
  local_48.super_Tuple3<pbrt::Vector3,_float>.z = local_e8;
  local_3c.super_Tuple3<pbrt::Vector3,_float>.y = local_54.super_Tuple3<pbrt::Vector3,_float>.y;
  local_3c.super_Tuple3<pbrt::Vector3,_float>.z = local_e8;
  VVar44 = Cross<float>((Vector3<float> *)&local_60,&local_48);
  local_c8.z = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21._8_56_ = auVar33;
  local_c8._0_8_ = vmovlps_avx(auVar21._0_16_);
  VVar44 = Normalize<float>((Vector3<float> *)&local_c8);
  auVar22._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar22._8_56_ = auVar33;
  local_b8._0_8_ = vmovlps_avx(auVar22._0_16_);
  auVar34 = auVar33;
  local_b8.z = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar46 = Cross<float>(&local_48,&local_54);
  local_f8.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar23._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar23._8_56_ = auVar34;
  local_f8._0_8_ = vmovlps_avx(auVar23._0_16_);
  VVar46 = Normalize<float>((Vector3<float> *)&local_f8);
  local_c8.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar24._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar24._8_56_ = auVar34;
  local_c8._0_8_ = vmovlps_avx(auVar24._0_16_);
  VVar46 = Cross<float>(&local_54,&local_3c);
  local_d8.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar25._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar25._8_56_ = auVar34;
  local_d8._0_8_ = vmovlps_avx(auVar25._0_16_);
  VVar46 = Normalize<float>((Vector3<float> *)&local_d8);
  local_f8.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar26._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar26._8_56_ = auVar34;
  local_f8._0_8_ = vmovlps_avx(auVar26._0_16_);
  VVar46 = Cross<float>(&local_3c,(Vector3<float> *)&local_60);
  local_160.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar27._8_56_ = auVar34;
  local_160._0_8_ = vmovlps_avx(auVar27._0_16_);
  VVar46 = Normalize<float>((Vector3<float> *)&local_160);
  local_d8.z = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar28._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar28._8_56_ = auVar34;
  local_d8._0_8_ = vmovlps_avx(auVar28._0_16_);
  auVar7._0_8_ = auVar22._0_8_ ^ 0x8000000080000000;
  auVar7._8_4_ = auVar33._0_4_ ^ 0x80000000;
  auVar7._12_4_ = auVar33._4_4_ ^ 0x80000000;
  local_160.z = -VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  local_160._0_8_ = vmovlps_avx(auVar7);
  FVar10 = AngleBetween<float>((Vector3<float> *)&local_160,(Vector3<float> *)&local_c8);
  auVar15._0_8_ = local_c8._0_8_ ^ 0x8000000080000000;
  auVar15._8_4_ = 0x80000000;
  auVar15._12_4_ = 0x80000000;
  local_160.z = -local_c8.z;
  local_160._0_8_ = vmovlps_avx(auVar15);
  FVar11 = AngleBetween<float>((Vector3<float> *)&local_160,(Vector3<float> *)&local_f8);
  local_118 = CONCAT44(local_118._4_4_,FVar11);
  auVar16._0_8_ = local_f8._0_8_ ^ 0x8000000080000000;
  auVar16._8_4_ = 0x80000000;
  auVar16._12_4_ = 0x80000000;
  local_160.z = -local_f8.z;
  local_160._0_8_ = vmovlps_avx(auVar16);
  FVar11 = AngleBetween<float>((Vector3<float> *)&local_160,(Vector3<float> *)&local_d8);
  auVar17._0_8_ = local_d8._0_8_ ^ 0x8000000080000000;
  auVar17._8_4_ = 0x80000000;
  auVar17._12_4_ = 0x80000000;
  local_160.z = -local_d8.z;
  local_160._0_8_ = vmovlps_avx(auVar17);
  FVar12 = AngleBetween<float>((Vector3<float> *)&local_160,(Vector3<float> *)&local_b8);
  if ((SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>,float*)
       ::reg == '\0') &&
     (iVar6 = __cxa_guard_acquire(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>,float*)
                                   ::reg), iVar6 != 0)) {
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)
               &SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>,float*)
                ::reg,SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::
                      Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt
                      ::Point2<float>,float*)::$_0::__invoke(pbrt::StatsAccumulator__,
               (PixelAccumFunc)0x0);
    __cxa_guard_release(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>,float*)
                         ::reg);
  }
  fVar40 = local_b8.z;
  fVar13 = local_f8.z;
  *(long *)(in_FS_OFFSET + -1000) = *(long *)(in_FS_OFFSET + -1000) + 1;
  dVar1 = (double)FVar10 + (double)(float)local_118 + (double)FVar11 + (double)FVar12 +
          -6.2831854820251465;
  auVar18._0_4_ = (float)dVar1;
  auVar18._4_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar18._8_8_ = 0;
  if (auVar18._0_4_ <= 0.0) {
    *(long *)(in_FS_OFFSET + -0x3f0) = *(long *)(in_FS_OFFSET + -0x3f0) + 1;
    if (pdf != (Float *)0x0) {
      *pdf = 0.0;
    }
  }
  else {
    if (pdf != (Float *)0x0) {
      auVar35._0_4_ = 1.0 / auVar18._0_4_;
      auVar35._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar19 = vmaxss_avx(auVar35,ZEXT816(0));
      *pdf = auVar19._0_4_;
    }
    if (0.001 <= auVar18._0_4_) {
      auVar19 = vfmsub132ss_fma(auVar18,ZEXT416((uint)FVar11),ZEXT416((uint)local_148._0_4_));
      fVar14 = auVar19._0_4_ - FVar12;
      auVar29._0_4_ = cosf(fVar14);
      auVar29._4_60_ = extraout_var;
      auVar19 = vfmsub132ss_fma(auVar29._0_16_,ZEXT416((uint)fVar13),ZEXT416((uint)fVar40));
      fVar13 = sinf(fVar14);
      auVar36._0_4_ = auVar19._0_4_ / fVar13;
      auVar36._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar19 = ZEXT416((uint)(fVar40 * fVar40 + auVar36._0_4_ * auVar36._0_4_));
      auVar19 = vsqrtss_avx(auVar19,auVar19);
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar7 = vpternlogd_avx512vl(ZEXT416((uint)(1.0 / auVar19._0_4_)),auVar36,auVar4,0xe4);
      auVar19 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar7);
      uVar2 = vcmpss_avx512f(auVar7,SUB6416(ZEXT464(0xbf7fffff),0),1);
      bVar3 = (bool)((byte)uVar2 & 1);
      auVar8._4_12_ = auVar19._4_12_;
      auVar8._0_4_ = (float)((uint)bVar3 * -0x40800001 + (uint)!bVar3 * auVar19._0_4_);
      auVar5._8_4_ = 0x80000000;
      auVar5._0_8_ = 0x8000000080000000;
      auVar5._12_4_ = 0x80000000;
      auVar7 = vxorps_avx512vl(auVar8,auVar5);
      auVar19 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar8._0_4_ * auVar8._0_4_)),ZEXT816(0) << 0x40);
      auVar19 = vsqrtss_avx(auVar19,auVar19);
      auVar41._0_4_ = (local_e8 * auVar7._0_4_) / auVar19._0_4_;
      auVar41._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar19 = vminss_avx(ZEXT416((uint)local_12c),auVar41);
      uVar2 = vcmpss_avx512f(auVar41,local_78,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      auVar9._4_12_ = auVar19._4_12_;
      auVar9._0_4_ = (float)((uint)bVar3 * local_78._0_4_ + (uint)!bVar3 * auVar19._0_4_);
      fVar14 = local_88._0_4_;
      auVar43._4_12_ = local_78._4_12_;
      auVar43._0_4_ = fVar14;
      auVar19 = ZEXT416((uint)(local_e8 * local_e8 + auVar9._0_4_ * auVar9._0_4_));
      auVar19 = vsqrtss_avx(auVar19,auVar19);
      fVar40 = auVar19._0_4_;
      fVar13 = fVar40 * fVar40;
      auVar42._0_4_ = fVar14 * fVar14 + fVar13;
      auVar42._4_4_ = local_78._4_4_ * local_78._4_4_ + fVar13;
      auVar42._8_4_ = local_78._8_4_ * local_78._8_4_ + fVar13;
      auVar42._12_4_ = local_78._12_4_ * local_78._12_4_ + fVar13;
      auVar7 = vmovshdup_avx(local_148);
      auVar19 = vsqrtps_avx(auVar42);
      auVar19 = vdivps_avx(auVar43,auVar19);
      auVar15 = vmovshdup_avx(auVar19);
      auVar19 = vhsubps_avx(auVar19,auVar19);
      auVar19 = vfmadd213ss_fma(auVar19,auVar7,auVar15);
      fVar13 = auVar19._0_4_;
      auVar19 = local_88;
      if (fVar13 * fVar13 < 0.999999) {
        fVar14 = 1.0 - fVar13 * fVar13;
        if (fVar14 < 0.0) {
          local_148 = auVar9;
          fVar14 = sqrtf(fVar14);
          auVar9 = local_148;
        }
        else {
          auVar19 = vsqrtss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
          fVar14 = auVar19._0_4_;
        }
        auVar19 = ZEXT416((uint)((fVar40 * fVar13) / fVar14));
      }
      auVar19 = vinsertps_avx(auVar9,auVar19,0x10);
      v.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar19._0_8_;
      v.super_Tuple3<pbrt::Vector3,_float>.z = local_e8;
      auVar33 = ZEXT856(auVar19._8_8_);
      VVar45 = Frame::FromLocal(&local_ac,v);
      local_160.z = VVar45.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar31._0_8_ = VVar45.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar31._8_56_ = auVar33;
      local_160._0_8_ = vmovlps_avx(auVar31._0_16_);
      TVar48 = (Tuple3<pbrt::Point3,_float>)
               Point3<float>::operator+(local_100,(Vector3<float> *)&local_160);
      return (Point3f)TVar48;
    }
  }
  auVar33 = ZEXT856((ulong)local_148._8_8_);
  VVar44 = Tuple3<pbrt::Vector3,float>::operator*(local_128,(float)local_148._0_4_);
  local_160.z = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar30._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar30._8_56_ = auVar33;
  local_160._0_8_ = vmovlps_avx(auVar30._0_16_);
  PVar47 = Point3<float>::operator+(local_150,(Vector3<float> *)&local_160);
  auVar19 = vmovshdup_avx(local_148);
  VVar44 = Tuple3<pbrt::Vector3,float>::operator*(local_120,auVar19._0_4_);
  local_198 = PVar47.super_Tuple3<pbrt::Point3,_float>.x;
  fStack_194 = PVar47.super_Tuple3<pbrt::Point3,_float>.y;
  TVar48.y = VVar44.super_Tuple3<pbrt::Vector3,_float>.y + fStack_194;
  TVar48.x = VVar44.super_Tuple3<pbrt::Vector3,_float>.x + local_198;
  TVar48.z = VVar44.super_Tuple3<pbrt::Vector3,_float>.z +
             PVar47.super_Tuple3<pbrt::Point3,_float>.z;
  return (Point3f)TVar48;
}

Assistant:

Point3f SampleSphericalRectangle(const Point3f &pRef, const Point3f &s,
                                 const Vector3f &ex, const Vector3f &ey, Point2f u,
                                 Float *pdf) {
    // Compute local reference frame and transform rectangle coordinates
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);
    Vector3f dLocal = R.ToLocal(s - pRef);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float x0 = dLocal.x, y0 = dLocal.y;
    Float x1 = x0 + exl, y1 = y0 + eyl;

    // Find plane normals to rectangle edges and compute internal angles
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);
    Vector3f n0 = Normalize(Cross(v00, v10)), n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01)), n3 = Normalize(Cross(v01, v00));
    Float g0 = AngleBetween(-n0, n1), g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3), g3 = AngleBetween(-n3, n0);

    // Compute spherical rectangle solid angle and PDF
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;
    CHECK_RARE(1e-5, solidAngle <= 0);
    if (solidAngle <= 0) {
        if (pdf != nullptr)
            *pdf = 0;
        return Point3f(s + u[0] * ex + u[1] * ey);
    }
    if (pdf != nullptr)
        *pdf = std::max<Float>(0, 1 / solidAngle);
    if (solidAngle < 1e-3)
        return Point3f(s + u[0] * ex + u[1] * ey);

    // Sample _cu_ for spherical rectangle sample
    Float b0 = n0.z, b1 = n2.z;
    // Float au = u[0] * solidAngle + k;   // original
    Float au = u[0] * solidAngle - g2 - g3;
    Float fu = (std::cos(au) * b0 - b1) / std::sin(au);
    Float cu = std::copysign(1 / std::sqrt(Sqr(fu) + Sqr(b0)), fu);
    cu = Clamp(cu, -OneMinusEpsilon, OneMinusEpsilon);  // avoid NaNs

    // Find _xu_ along $x$ edge for spherical rectangle sample
    Float xu = -(cu * z0) / SafeSqrt(1 - Sqr(cu));
    xu = Clamp(xu, x0, x1);

    // Find _xv_ along $y$ edge for spherical rectangle sample
    Float dd = std::sqrt(Sqr(xu) + Sqr(z0));
    Float h0 = y0 / std::sqrt(Sqr(dd) + Sqr(y0));
    Float h1 = y1 / std::sqrt(Sqr(dd) + Sqr(y1));
    Float hv = h0 + u[1] * (h1 - h0), hvsq = Sqr(hv);
    Float yv = (hvsq < 1 - 1e-6f) ? (hv * dd) / std::sqrt(1 - hvsq) : y1;

    // Return spherical triangle sample in original coordinate system
    return pRef + R.FromLocal(Vector3f(xu, yv, z0));
}